

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRSubgraphMining.cpp
# Opt level: O3

void dgrminer::find_addition_edges
               (AdjacencyListCrate *adjacency_list,
               vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
               *antecedent_pattern_edges_ADDED,
               map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
               *from_pattern_id_to_adj_id_map,int num_of_nondummy_nodes,
               vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
               *edge_mapping_sets,
               set<int,_std::less<int>,_std::allocator<int>_> *edges_occupied_by_antecedent,
               bool debug)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  int iVar3;
  _Rb_tree_color _Var4;
  long *plVar5;
  int *piVar6;
  pointer paVar7;
  mapped_type *pmVar8;
  ostream *this;
  pointer pvVar9;
  pointer paVar10;
  ulong uVar11;
  int *piVar12;
  _Base_ptr p_Var13;
  pointer piVar14;
  _Base_ptr p_Var15;
  long lVar16;
  int iVar17;
  _Base_ptr p_Var18;
  _Base_ptr p_Var19;
  _Base_ptr p_Var20;
  ulong uVar21;
  int iVar22;
  bool bVar23;
  pair<std::_Rb_tree_iterator<int>,_std::_Rb_tree_iterator<int>_> pVar24;
  vector<int,_std::allocator<int>_> selected_ids_from_adj;
  vector<int,_std::allocator<int>_> which_indices_should_be_used_next;
  set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
  edge_mapping_set;
  int_pair edge_mapping_pair;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adj_more_info;
  set<int,_std::less<int>,_std::allocator<int>_> which_edge_ids_are_used;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adj_list;
  vector<int,_std::allocator<int>_> local_168;
  vector<int,_std::allocator<int>_> local_148;
  map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_> *local_128;
  vector<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_> *local_120;
  vector<bool,_std::allocator<bool>_> local_118;
  ulong local_f0;
  _Base_ptr local_e8;
  int local_dc;
  _Rb_tree<dgrminer::int_pair,_dgrminer::int_pair,_std::_Identity<dgrminer::int_pair>,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
  local_d8;
  set<int,_std::less<int>,_std::allocator<int>_> *local_a8;
  int_pair local_a0;
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  local_98;
  vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
  *local_80;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> local_78;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  local_48;
  
  local_120 = antecedent_pattern_edges_ADDED;
  local_dc = num_of_nondummy_nodes;
  local_a8 = edges_occupied_by_antecedent;
  local_80 = edge_mapping_sets;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(&local_48,&adjacency_list->adjacencyList);
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector(&local_98,&adjacency_list->adjacencyEdgeInfo);
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (int *)0x0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_78._M_impl.super__Rb_tree_header._M_header;
  local_78._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_78._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_78._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8._M_impl._0_4_ = 0;
  local_78._M_impl.super__Rb_tree_header._M_header._M_right =
       local_78._M_impl.super__Rb_tree_header._M_header._M_left;
  std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
            (&local_148,(iterator)0x0,(int *)&local_d8);
  local_e8 = &(local_a8->_M_t)._M_impl.super__Rb_tree_header._M_header;
  iVar22 = 0;
  local_128 = from_pattern_id_to_adj_id_map;
LAB_00110348:
  do {
    if (debug) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"CURRENT INDEX: ",0xf);
      plVar5 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar22);
      std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
      std::ostream::put((char)plVar5);
      std::ostream::flush();
    }
    paVar7 = (local_120->
             super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar11 = ((long)(local_120->
                    super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)paVar7 >> 3) *
             -0x3333333333333333;
    uVar21 = (ulong)iVar22;
    if (uVar11 < uVar21 || uVar11 - uVar21 == 0) {
      local_d8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_d8._M_impl.super__Rb_tree_header._M_header;
      local_d8._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_d8._M_impl.super__Rb_tree_header._M_header._M_right =
           local_d8._M_impl.super__Rb_tree_header._M_header._M_left;
      if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        lVar16 = 9;
        uVar11 = 0;
        piVar6 = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        piVar12 = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        do {
          uVar21 = uVar11 + 0x3f;
          if (-1 < (long)uVar11) {
            uVar21 = uVar11;
          }
          if ((local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_start.super__Bit_iterator_base._M_p
               [((long)uVar21 >> 6) +
                ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)] >>
               (uVar11 & 0x3f) & 1) == 0) {
            local_a0.first =
                 ((local_120->
                  super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->_M_elems[lVar16];
            local_a0.second = piVar6[uVar11];
            std::
            _Rb_tree<dgrminer::int_pair,dgrminer::int_pair,std::_Identity<dgrminer::int_pair>,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>
            ::_M_insert_unique<dgrminer::int_pair_const&>
                      ((_Rb_tree<dgrminer::int_pair,dgrminer::int_pair,std::_Identity<dgrminer::int_pair>,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>
                        *)&local_d8,&local_a0);
            piVar6 = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            piVar12 = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish;
          }
          uVar11 = uVar11 + 1;
          lVar16 = lVar16 + 10;
        } while (uVar11 < (ulong)((long)piVar12 - (long)piVar6 >> 2));
      }
      std::
      vector<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>,_std::allocator<std::set<dgrminer::int_pair,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>_>_>
      ::push_back(local_80,(value_type *)&local_d8);
      uVar11 = (ulong)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
      uVar21 = (ulong)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e;
      if (-1 < (long)uVar11) {
        uVar21 = uVar11;
      }
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      if ((local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p
           [((long)uVar21 >> 6) + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           >> (uVar11 & 0x3f) & 1) == 0) {
        pVar24 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                 ::equal_range(&local_78,
                               local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + -1);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_erase_aux(&local_78,(_Base_ptr)pVar24.first._M_node,(_Base_ptr)pVar24.second._M_node);
      }
      bVar23 = local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish.super__Bit_iterator_base._M_offset == 0;
      local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset =
           local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset - 1;
      if (bVar23) {
        local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
        local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p =
             local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p + -1;
      }
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      iVar22 = iVar22 + -1;
      std::
      _Rb_tree<dgrminer::int_pair,_dgrminer::int_pair,_std::_Identity<dgrminer::int_pair>,_std::less<dgrminer::int_pair>,_std::allocator<dgrminer::int_pair>_>
      ::~_Rb_tree(&local_d8);
      paVar7 = (local_120->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar21 = (ulong)iVar22;
    }
    local_d8._M_impl._0_1_ =
         *(_Rb_tree<dgrminer::int_pair,dgrminer::int_pair,std::_Identity<dgrminer::int_pair>,std::less<dgrminer::int_pair>,std::allocator<dgrminer::int_pair>>
           *)(paVar7 + uVar21);
    pmVar8 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](from_pattern_id_to_adj_id_map,(key_type_conflict *)&local_d8);
    iVar2 = *pmVar8;
    local_d8._M_impl._0_1_ =
         (char)(local_120->
               super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>).
               _M_impl.super__Vector_impl_data._M_start[uVar21]._M_elems[1];
    pmVar8 = std::map<char,_int,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>::
             operator[](from_pattern_id_to_adj_id_map,(key_type_conflict *)&local_d8);
    from_pattern_id_to_adj_id_map = local_128;
    iVar3 = *pmVar8;
    iVar17 = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_start[uVar21];
    if (iVar2 < local_dc && iVar3 < local_dc) {
      uVar11 = (ulong)iVar17;
      piVar14 = local_48.
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar2].
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_start;
      pvVar9 = local_48.
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_f0 = uVar21;
      if (uVar11 < (ulong)((long)local_48.
                                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_finish - (long)piVar14 >> 2)) {
        do {
          if (piVar14[uVar11] == iVar3) {
            if (debug) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,"FOUND POSSIBLE EDGE ",0x14);
              this = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
              std::__ostream_insert<char,std::char_traits<char>>(this,", ",2);
              plVar5 = (long *)std::ostream::operator<<(this,iVar3);
              std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
              std::ostream::put((char)plVar5);
              std::ostream::flush();
            }
            bVar23 = is_adj_info_equal_to_pattern_edge
                               (local_98.
                                super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar2].
                                super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar11,
                                (local_120->
                                super__Vector_base<std::array<int,_10UL>,_std::allocator<std::array<int,_10UL>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + uVar21,true);
            from_pattern_id_to_adj_id_map = local_128;
            piVar6 = local_98.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar2].
                     super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_elems + 7;
            p_Var15 = &local_78._M_impl.super__Rb_tree_header._M_header;
            if (local_78._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
              iVar17 = *piVar6;
              p_Var18 = local_78._M_impl.super__Rb_tree_header._M_header._M_parent;
              do {
                p_Var19 = p_Var18;
                p_Var20 = p_Var15;
                _Var4 = p_Var19[1]._M_color;
                p_Var13 = p_Var19;
                if ((int)_Var4 < iVar17) {
                  p_Var13 = p_Var20;
                }
                p_Var15 = p_Var13;
                p_Var18 = (&p_Var19->_M_left)[(int)_Var4 < iVar17];
              } while ((&p_Var19->_M_left)[(int)_Var4 < iVar17] != (_Base_ptr)0x0);
              p_Var1 = &local_78._M_impl.super__Rb_tree_header;
              p_Var15 = &p_Var1->_M_header;
              if ((_Rb_tree_header *)p_Var13 != p_Var1) {
                if ((int)_Var4 < iVar17) {
                  p_Var19 = p_Var20;
                }
                p_Var15 = p_Var13;
                if (iVar17 < (int)p_Var19[1]._M_color) {
                  p_Var15 = &p_Var1->_M_header;
                }
              }
            }
            p_Var18 = (local_a8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
            p_Var19 = local_e8;
            if (p_Var18 != (_Base_ptr)0x0) {
              iVar17 = *piVar6;
              p_Var13 = local_e8;
              do {
                if (iVar17 <= (int)p_Var18[1]._M_color) {
                  p_Var13 = p_Var18;
                }
                p_Var18 = (&p_Var18->_M_left)[(int)p_Var18[1]._M_color < iVar17];
              } while (p_Var18 != (_Base_ptr)0x0);
              if ((p_Var13 != local_e8) && (p_Var19 = p_Var13, iVar17 < (int)p_Var13[1]._M_color)) {
                p_Var19 = local_e8;
              }
            }
            pvVar9 = local_48.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            if ((((_Rb_tree_header *)p_Var15 == &local_78._M_impl.super__Rb_tree_header) && (bVar23)
                ) && (p_Var19 == local_e8)) {
              if (debug) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"IT MATCHES",10);
                std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
                std::ostream::put('p');
                std::ostream::flush();
              }
              local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[local_f0] = (int)uVar11 + 1;
              local_d8._M_impl._0_4_ = 0;
              if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (&local_148,
                           (iterator)
                           local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,(int *)&local_d8);
              }
              else {
                *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = 0;
                local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              std::vector<bool,_std::allocator<bool>_>::push_back(&local_118,false);
              paVar10 = local_98.
                        super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[iVar2].
                        super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)&local_168,
                           (iterator)
                           local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish,paVar10[uVar11]._M_elems + 7);
                paVar10 = local_98.
                          super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar2].
                          super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                          ._M_impl.super__Vector_impl_data._M_start;
              }
              else {
                *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish = paVar10[uVar11]._M_elems[7];
                local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish + 1;
              }
              std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
              _M_insert_unique<int_const&>
                        ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )&local_78,paVar10[uVar11]._M_elems + 7);
              iVar22 = iVar22 + 1;
              goto LAB_001109e3;
            }
          }
          uVar11 = uVar11 + 1;
          piVar14 = pvVar9[iVar2].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (uVar11 < (ulong)((long)pvVar9[iVar2].super__Vector_base<int,_std::allocator<int>_>.
                                        _M_impl.super__Vector_impl_data._M_finish - (long)piVar14 >>
                                 2));
        iVar17 = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[local_f0];
      }
      from_pattern_id_to_adj_id_map = local_128;
      if (iVar17 != 0x7fffffff) {
        local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start[local_f0] = 0x7fffffff;
        local_d8._M_impl._0_4_ = 0;
        if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_148,
                     (iterator)
                     local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_d8);
        }
        else {
          *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = 0;
          local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
        std::vector<bool,_std::allocator<bool>_>::push_back(&local_118,true);
        local_d8._M_impl._0_4_ = 0xffffffff;
        if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish ==
            local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&local_168,
                     (iterator)
                     local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,(int *)&local_d8);
        }
        else {
LAB_001109c2:
          local_d8._M_impl._0_4_ = 0xffffffff;
          *local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish = -1;
          local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 1;
        }
LAB_001109e0:
        iVar22 = iVar22 + 1;
      }
    }
    else if (iVar17 != 0x7fffffff) {
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[uVar21] = 0x7fffffff;
      local_d8._M_impl._0_4_ = 0;
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_148,
                   (iterator)
                   local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_d8);
      }
      else {
        *local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = 0;
        local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      std::vector<bool,_std::allocator<bool>_>::push_back(&local_118,true);
      local_d8._M_impl._0_4_ = 0xffffffff;
      if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) goto LAB_001109c2;
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&local_168,
                 (iterator)
                 local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(int *)&local_d8);
      goto LAB_001109e0;
    }
LAB_001109e3:
    if (iVar22 != 0) {
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[iVar22] != 0x7fffffff) goto LAB_00110348;
      uVar11 = (ulong)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset - 1;
      uVar21 = (ulong)local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset + 0x3e;
      if (-1 < (long)uVar11) {
        uVar21 = uVar11;
      }
      local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      if ((local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_p
           [((long)uVar21 >> 6) + ((ulong)((uVar11 & 0x800000000000003f) < 0x8000000000000001) - 1)]
           >> (uVar11 & 0x3f) & 1) == 0) {
        pVar24 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                 ::equal_range(&local_78,
                               local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish + -1);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_erase_aux(&local_78,(_Base_ptr)pVar24.first._M_node,(_Base_ptr)pVar24.second._M_node);
      }
      bVar23 = local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
               ._M_finish.super__Bit_iterator_base._M_offset == 0;
      local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
      _M_finish.super__Bit_iterator_base._M_offset =
           local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_finish.super__Bit_iterator_base._M_offset - 1;
      if (bVar23) {
        local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_offset = 0x3f;
        local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_finish.super__Bit_iterator_base._M_p =
             local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_finish.super__Bit_iterator_base._M_p + -1;
      }
      local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish + -1;
      iVar22 = iVar22 + -1;
      if (iVar22 != 0) goto LAB_00110348;
    }
    iVar22 = 0;
    if (*local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start == 0x7fffffff) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&local_78);
      if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
          _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
        operator_delete(local_118.super__Bvector_base<std::allocator<bool>_>._M_impl.
                        super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
      }
      if (local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (int *)0x0) {
        operator_delete(local_168.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      std::
      vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
      ::~vector(&local_98);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::~vector(&local_48);
      return;
    }
  } while( true );
}

Assistant:

void find_addition_edges(AdjacencyListCrate & adjacency_list, std::vector<std::array<int, PAT___SIZE>> & antecedent_pattern_edges_ADDED,
		std::map<char, int> & from_pattern_id_to_adj_id_map, int num_of_nondummy_nodes, std::vector<std::set<int_pair>> & edge_mapping_sets,
		std::set<int> & edges_occupied_by_antecedent, bool debug)
	{
		std::vector<std::vector<int>> adj_list = adjacency_list.adjacencyList;
		std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adj_more_info = adjacency_list.adjacencyEdgeInfo;

		int special_symbol_for_max_index = std::numeric_limits<int>::max();

		int number_of_created_dummy_edges = 0;

		int current_index = 0; // which of the antecedent_pattern_edges_ADDED are we currently processing

		std::vector<int> selected_ids_from_adj; // which IDS of adj nodes correspond to those in antecedent_pattern_isolated_node_id
		std::vector<bool> is_the_used_edge_dummy;
		std::vector<int> which_indices_should_be_used_next;

		std::set<int> which_edge_ids_are_used;

		which_indices_should_be_used_next.push_back(0); // for the first addition edge, we want to start from the first neighbor in the adjacency list

		// DO DFS:
		while (true)
		{

			if (debug) cout << "CURRENT INDEX: " << current_index << endl;
			// if all ADDITION edges were mapped:
			if (antecedent_pattern_edges_ADDED.size() <= current_index)
			{
                // WE FOUND ALL EDGES (pattern --> adjacency) antecedent_pattern_edges_ADDED[i][PAT_ID] --> selected_ids_from_adj[i]

				// save all pairs PATTERN_EDGE_ID->ADJ_EDGE_ID for non-dummy edges
				std::set<int_pair> edge_mapping_set;
				for (size_t i = 0; i < selected_ids_from_adj.size(); i++)
				{
					if (!is_the_used_edge_dummy[i])
					{
						int_pair edge_mapping_pair;
						edge_mapping_pair.first = antecedent_pattern_edges_ADDED[i][PAT_ID];
						edge_mapping_pair.second = selected_ids_from_adj[i];
						edge_mapping_set.insert(edge_mapping_pair);
					}
				}
				// now save this edge_mapping_set (then we check if it is not a subset of another mapping.. and remove all subsets of this mapping)
				edge_mapping_sets.push_back(edge_mapping_set);

				// AND BACKTRACK:

				bool was_the_edge_dummy = is_the_used_edge_dummy.back();

				which_indices_should_be_used_next.pop_back();
				if (was_the_edge_dummy)
				{
					number_of_created_dummy_edges--;
				}
				else
				{
					which_edge_ids_are_used.erase(selected_ids_from_adj.back());
				}

				is_the_used_edge_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				current_index--;
			}

			int src_id = from_pattern_id_to_adj_id_map[antecedent_pattern_edges_ADDED[current_index][PAT_SRC_ID]];
			int dst_id = from_pattern_id_to_adj_id_map[antecedent_pattern_edges_ADDED[current_index][PAT_DST_ID]];
			// all non_dummy nodes have ID < num_of_nondummy_nodes, so we can check which nodes are dummy by:
			bool src_is_dummy = src_id >= num_of_nondummy_nodes;
			bool dst_is_dummy = dst_id >= num_of_nondummy_nodes;

			// if at least one node of the edge is dummy, then the edge itself is dummy
			if (src_is_dummy || dst_is_dummy)
			{
				// and if we didn't just try it as dummy:
				if (which_indices_should_be_used_next[current_index] != special_symbol_for_max_index)
				{
					// map it as dummy:
					which_indices_should_be_used_next[current_index] = special_symbol_for_max_index;
					which_indices_should_be_used_next.push_back(0);

					is_the_used_edge_dummy.push_back(true);

					selected_ids_from_adj.push_back(-1); // push there arbitrary number (the number is not used)

					number_of_created_dummy_edges++;

					current_index++;
				}
			}
			// if no node of the edge is dummy, then the edge itself can be dummy but doesn't have to be
			else
			{
				bool should_try_dummy = true;

				int src_index = which_indices_should_be_used_next[current_index];

				for (; src_index < adj_list[src_id].size(); src_index++)
				{
					if (adj_list[src_id][src_index] == dst_id)
					{
						if (debug) cout << "FOUND POSSIBLE EDGE " << src_id << ", " << dst_id << endl;
						bool matches = is_adj_info_equal_to_pattern_edge(adj_more_info[src_id][src_index], antecedent_pattern_edges_ADDED[current_index], true);
						bool was_already_used = which_edge_ids_are_used.find(adj_more_info[src_id][src_index][ADJ_INFO_ID]) != which_edge_ids_are_used.end();

						bool is_edge_occcupied = edges_occupied_by_antecedent.find(adj_more_info[src_id][src_index][ADJ_INFO_ID]) != edges_occupied_by_antecedent.end();

						if (matches && !was_already_used && !is_edge_occcupied)
						{
							if (debug) cout << "IT MATCHES" << endl;

							should_try_dummy = false;


							which_indices_should_be_used_next[current_index] = src_index + 1;
							which_indices_should_be_used_next.push_back(0);

							is_the_used_edge_dummy.push_back(false);
							selected_ids_from_adj.push_back(adj_more_info[src_id][src_index][ADJ_INFO_ID]);

							which_edge_ids_are_used.insert(adj_more_info[src_id][src_index][ADJ_INFO_ID]);
							current_index++;
							break;
						}
					}
				}


				// if we tried all regular edges and should backtrack, try to map to a dummy edge first:
				if (should_try_dummy && which_indices_should_be_used_next[current_index] != special_symbol_for_max_index)
				{
					//which_indices_should_be_used_next[current_index] = adj_list[from_id].size() + 1;
					which_indices_should_be_used_next[current_index] = special_symbol_for_max_index;
					which_indices_should_be_used_next.push_back(0);

					is_the_used_edge_dummy.push_back(true);

					selected_ids_from_adj.push_back(-1); // push there arbitrary number (the number is not used)

					number_of_created_dummy_edges++;

					current_index++;
				}
			}

			if (current_index != 0 && which_indices_should_be_used_next[current_index] == special_symbol_for_max_index)
			{
				// now we also tried the dummy one, so really backtrack
				bool was_the_edge_dummy = is_the_used_edge_dummy.back();

				which_indices_should_be_used_next.pop_back();
				if (was_the_edge_dummy)
				{
					number_of_created_dummy_edges--;
				}
				else
				{
					which_edge_ids_are_used.erase(selected_ids_from_adj.back());
				}

				is_the_used_edge_dummy.pop_back();
				selected_ids_from_adj.pop_back();
				current_index--;
			}

			if (current_index == 0 && which_indices_should_be_used_next[current_index] == special_symbol_for_max_index)
			{
				// we tried all combinations, just end:
				break;
			}

		}

	}